

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_routines.c
# Opt level: O2

int WebRtcIsac_EncTerminate(Bitstr *streamdata)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint8_t *puVar4;
  uint32_t uVar5;
  
  uVar1 = streamdata->stream_index;
  puVar4 = streamdata->stream + uVar1;
  uVar2 = streamdata->streamval;
  if (streamdata->W_upper < 0x2000000) {
    uVar5 = uVar2 + 0x10000;
    streamdata->streamval = uVar5;
    if (0xfffeffff < uVar2) {
      puVar4 = streamdata->stream + uVar1;
      do {
        puVar4 = puVar4 + -1;
        *puVar4 = *puVar4 + '\x01';
      } while (*puVar4 == '\0');
      uVar5 = streamdata->streamval;
      puVar4 = streamdata->stream + streamdata->stream_index;
    }
    *puVar4 = (uint8_t)(uVar5 >> 0x18);
    puVar4[1] = *(uint8_t *)((long)&streamdata->streamval + 2);
    iVar3 = (int)puVar4 + 2;
  }
  else {
    uVar5 = uVar2 + 0x1000000;
    streamdata->streamval = uVar5;
    if (0xfeffffff < uVar2) {
      puVar4 = streamdata->stream + uVar1;
      do {
        puVar4 = puVar4 + -1;
        *puVar4 = *puVar4 + '\x01';
      } while (*puVar4 == '\0');
      uVar5 = streamdata->streamval;
      puVar4 = streamdata->stream + streamdata->stream_index;
    }
    *puVar4 = (uint8_t)(uVar5 >> 0x18);
    iVar3 = (int)puVar4 + 1;
  }
  return iVar3 - (int)streamdata;
}

Assistant:

int WebRtcIsac_EncTerminate(Bitstr *streamdata) /* in-/output struct containing bitstream */
{
  uint8_t *stream_ptr;


  /* point to the right place in the stream buffer */
  stream_ptr = streamdata->stream + streamdata->stream_index;

  /* find minimum length (determined by current interval width) */
  if ( streamdata->W_upper > 0x01FFFFFF )
  {
    streamdata->streamval += 0x01000000;
    /* add carry to buffer */
    if (streamdata->streamval < 0x01000000)
    {
      /* propagate carry */
      while ( !(++(*--stream_ptr)) );
      /* put pointer back to the old value */
      stream_ptr = streamdata->stream + streamdata->stream_index;
    }
    /* write remaining data to bitstream */
    *stream_ptr++ = (uint8_t) (streamdata->streamval >> 24);
  }
  else
  {
    streamdata->streamval += 0x00010000;
    /* add carry to buffer */
    if (streamdata->streamval < 0x00010000)
    {
      /* propagate carry */
      while ( !(++(*--stream_ptr)) );
      /* put pointer back to the old value */
      stream_ptr = streamdata->stream + streamdata->stream_index;
    }
    /* write remaining data to bitstream */
    *stream_ptr++ = (uint8_t) (streamdata->streamval >> 24);
    *stream_ptr++ = (uint8_t) ((streamdata->streamval >> 16) & 0x00FF);
  }

  /* calculate stream length */
  return (int)(stream_ptr - streamdata->stream);
}